

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::pattern_formatter::handle_flag_(pattern_formatter *this,char flag,padding_info padding)

{
  pointer paVar1;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_290;
  unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
  local_288;
  __single_object unknown_flag;
  unique_ptr<spdlog::details::ch_formatter,_std::default_delete<spdlog::details::ch_formatter>_>
  local_278;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_270;
  undefined1 local_268 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_260;
  undefined1 local_258 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_250;
  undefined1 local_248 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_240;
  undefined1 local_238 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_230;
  undefined1 local_228 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_220;
  undefined1 local_218 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_210;
  undefined1 local_208 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_200;
  undefined1 local_1f8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1f0;
  undefined1 local_1e8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1e0;
  undefined1 local_1d8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1d0;
  undefined1 local_1c8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1c0;
  undefined1 local_1b8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1b0;
  undefined1 local_1a8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_1a0;
  undefined1 local_198 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_190;
  undefined1 local_188 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_180;
  undefined1 local_178 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_170;
  undefined1 local_168 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_160;
  undefined1 local_158 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_150;
  undefined1 local_148 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_140;
  undefined1 local_138 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_130;
  undefined1 local_128 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_120;
  undefined1 local_118 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_110;
  undefined1 local_108 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_100;
  undefined1 local_f8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_f0;
  undefined1 local_e8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_e0;
  undefined1 local_d8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_d0;
  undefined1 local_c8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_c0;
  undefined1 local_b8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_b0;
  undefined1 local_a8 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_a0;
  undefined1 local_98 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_90;
  undefined1 local_88 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_80;
  undefined1 local_78 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_70;
  undefined1 local_68 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_60;
  undefined1 local_58 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_50 [3];
  undefined1 local_38 [8];
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  local_30;
  char local_21;
  pattern_formatter *ppStack_20;
  char flag_local;
  pattern_formatter *this_local;
  padding_info padding_local;
  
  this_local = (pattern_formatter *)padding.width_;
  padding_local.width_._0_4_ = padding.side_;
  local_21 = flag;
  ppStack_20 = this;
  switch(flag) {
  case '#':
    std::make_unique<spdlog::details::source_linenum_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_268);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::source_linenum_formatter,std::default_delete<spdlog::details::source_linenum_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_260,
               (unique_ptr<spdlog::details::source_linenum_formatter,_std::default_delete<spdlog::details::source_linenum_formatter>_>
                *)local_268);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_260);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_260);
    std::
    unique_ptr<spdlog::details::source_linenum_formatter,_std::default_delete<spdlog::details::source_linenum_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_linenum_formatter,_std::default_delete<spdlog::details::source_linenum_formatter>_>
                   *)local_268);
    break;
  case '$':
    std::make_unique<spdlog::details::color_stop_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_238);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::color_stop_formatter,std::default_delete<spdlog::details::color_stop_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_230,
               (unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
                *)local_238);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_230);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_230);
    std::
    unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::color_stop_formatter,_std::default_delete<spdlog::details::color_stop_formatter>_>
                   *)local_238);
    break;
  case '%':
    unknown_flag._M_t.
    super___uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ._M_t.
    super__Tuple_impl<0UL,_spdlog::details::aggregate_formatter_*,_std::default_delete<spdlog::details::aggregate_formatter>_>
    .super__Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false>._M_head_impl._7_1_ = 0x25;
    std::make_unique<spdlog::details::ch_formatter,char>((char *)&local_278);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::ch_formatter,std::default_delete<spdlog::details::ch_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_270,&local_278);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_270);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_270);
    std::
    unique_ptr<spdlog::details::ch_formatter,_std::default_delete<spdlog::details::ch_formatter>_>::
    ~unique_ptr(&local_278);
    break;
  default:
    std::make_unique<spdlog::details::aggregate_formatter>();
    paVar1 = std::
             unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
             ::operator->(&local_288);
    details::aggregate_formatter::add_ch(paVar1,'%');
    paVar1 = std::
             unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
             ::operator->(&local_288);
    details::aggregate_formatter::add_ch(paVar1,local_21);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::aggregate_formatter,std::default_delete<spdlog::details::aggregate_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_290,&local_288);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_290);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_290);
    std::
    unique_ptr<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
    ::~unique_ptr(&local_288);
    break;
  case '+':
    std::make_unique<spdlog::details::full_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_38);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::full_formatter,std::default_delete<spdlog::details::full_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_30,
               (unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
                *)local_38);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_30);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_30);
    std::
    unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::full_formatter,_std::default_delete<spdlog::details::full_formatter>_>
                   *)local_38);
    break;
  case '@':
    std::make_unique<spdlog::details::source_location_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_248);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::source_location_formatter,std::default_delete<spdlog::details::source_location_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_240,
               (unique_ptr<spdlog::details::source_location_formatter,_std::default_delete<spdlog::details::source_location_formatter>_>
                *)local_248);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_240);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_240);
    std::
    unique_ptr<spdlog::details::source_location_formatter,_std::default_delete<spdlog::details::source_location_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_location_formatter,_std::default_delete<spdlog::details::source_location_formatter>_>
                   *)local_248);
    break;
  case 'A':
    std::make_unique<spdlog::details::A_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_b8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::A_formatter,std::default_delete<spdlog::details::A_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_b0,
               (unique_ptr<spdlog::details::A_formatter,_std::default_delete<spdlog::details::A_formatter>_>
                *)local_b8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_b0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_b0);
    std::
    unique_ptr<spdlog::details::A_formatter,_std::default_delete<spdlog::details::A_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::A_formatter,_std::default_delete<spdlog::details::A_formatter>_>
                 *)local_b8);
    break;
  case 'B':
    std::make_unique<spdlog::details::B_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_d8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::B_formatter,std::default_delete<spdlog::details::B_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_d0,
               (unique_ptr<spdlog::details::B_formatter,_std::default_delete<spdlog::details::B_formatter>_>
                *)local_d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_d0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_d0);
    std::
    unique_ptr<spdlog::details::B_formatter,_std::default_delete<spdlog::details::B_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::B_formatter,_std::default_delete<spdlog::details::B_formatter>_>
                 *)local_d8);
    break;
  case 'C':
    std::make_unique<spdlog::details::C_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_f8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::C_formatter,std::default_delete<spdlog::details::C_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_f0,
               (unique_ptr<spdlog::details::C_formatter,_std::default_delete<spdlog::details::C_formatter>_>
                *)local_f8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_f0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_f0);
    std::
    unique_ptr<spdlog::details::C_formatter,_std::default_delete<spdlog::details::C_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::C_formatter,_std::default_delete<spdlog::details::C_formatter>_>
                 *)local_f8);
    break;
  case 'D':
  case 'x':
    std::make_unique<spdlog::details::D_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_118);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::D_formatter,std::default_delete<spdlog::details::D_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_110,
               (unique_ptr<spdlog::details::D_formatter,_std::default_delete<spdlog::details::D_formatter>_>
                *)local_118);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_110);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_110);
    std::
    unique_ptr<spdlog::details::D_formatter,_std::default_delete<spdlog::details::D_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::D_formatter,_std::default_delete<spdlog::details::D_formatter>_>
                 *)local_118);
    break;
  case 'E':
    std::make_unique<spdlog::details::E_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_1b8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::E_formatter,std::default_delete<spdlog::details::E_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_1b0,
               (unique_ptr<spdlog::details::E_formatter,_std::default_delete<spdlog::details::E_formatter>_>
                *)local_1b8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_1b0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_1b0);
    std::
    unique_ptr<spdlog::details::E_formatter,_std::default_delete<spdlog::details::E_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::E_formatter,_std::default_delete<spdlog::details::E_formatter>_>
                 *)local_1b8);
    break;
  case 'F':
    std::make_unique<spdlog::details::F_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_1a8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::F_formatter,std::default_delete<spdlog::details::F_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_1a0,
               (unique_ptr<spdlog::details::F_formatter,_std::default_delete<spdlog::details::F_formatter>_>
                *)local_1a8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_1a0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_1a0);
    std::
    unique_ptr<spdlog::details::F_formatter,_std::default_delete<spdlog::details::F_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::F_formatter,_std::default_delete<spdlog::details::F_formatter>_>
                 *)local_1a8);
    break;
  case 'H':
    std::make_unique<spdlog::details::H_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_148);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::H_formatter,std::default_delete<spdlog::details::H_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_140,
               (unique_ptr<spdlog::details::H_formatter,_std::default_delete<spdlog::details::H_formatter>_>
                *)local_148);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_140);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_140);
    std::
    unique_ptr<spdlog::details::H_formatter,_std::default_delete<spdlog::details::H_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::H_formatter,_std::default_delete<spdlog::details::H_formatter>_>
                 *)local_148);
    break;
  case 'I':
    std::make_unique<spdlog::details::I_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_158);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::I_formatter,std::default_delete<spdlog::details::I_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_150,
               (unique_ptr<spdlog::details::I_formatter,_std::default_delete<spdlog::details::I_formatter>_>
                *)local_158);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_150);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_150);
    std::
    unique_ptr<spdlog::details::I_formatter,_std::default_delete<spdlog::details::I_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::I_formatter,_std::default_delete<spdlog::details::I_formatter>_>
                 *)local_158);
    break;
  case 'L':
    std::make_unique<spdlog::details::short_level_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_78);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::short_level_formatter,std::default_delete<spdlog::details::short_level_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_70,
               (unique_ptr<spdlog::details::short_level_formatter,_std::default_delete<spdlog::details::short_level_formatter>_>
                *)local_78);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_70);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_70);
    std::
    unique_ptr<spdlog::details::short_level_formatter,_std::default_delete<spdlog::details::short_level_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::short_level_formatter,_std::default_delete<spdlog::details::short_level_formatter>_>
                   *)local_78);
    break;
  case 'M':
    std::make_unique<spdlog::details::M_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_168);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::M_formatter,std::default_delete<spdlog::details::M_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_160,
               (unique_ptr<spdlog::details::M_formatter,_std::default_delete<spdlog::details::M_formatter>_>
                *)local_168);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_160);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_160);
    std::
    unique_ptr<spdlog::details::M_formatter,_std::default_delete<spdlog::details::M_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::M_formatter,_std::default_delete<spdlog::details::M_formatter>_>
                 *)local_168);
    break;
  case 'P':
    std::make_unique<spdlog::details::pid_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_218);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::pid_formatter,std::default_delete<spdlog::details::pid_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_210,
               (unique_ptr<spdlog::details::pid_formatter,_std::default_delete<spdlog::details::pid_formatter>_>
                *)local_218);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_210);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_210);
    std::
    unique_ptr<spdlog::details::pid_formatter,_std::default_delete<spdlog::details::pid_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::pid_formatter,_std::default_delete<spdlog::details::pid_formatter>_>
                   *)local_218);
    break;
  case 'R':
    std::make_unique<spdlog::details::R_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_1e8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::R_formatter,std::default_delete<spdlog::details::R_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_1e0,
               (unique_ptr<spdlog::details::R_formatter,_std::default_delete<spdlog::details::R_formatter>_>
                *)local_1e8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_1e0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_1e0);
    std::
    unique_ptr<spdlog::details::R_formatter,_std::default_delete<spdlog::details::R_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::R_formatter,_std::default_delete<spdlog::details::R_formatter>_>
                 *)local_1e8);
    break;
  case 'S':
    std::make_unique<spdlog::details::S_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_178);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::S_formatter,std::default_delete<spdlog::details::S_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_170,
               (unique_ptr<spdlog::details::S_formatter,_std::default_delete<spdlog::details::S_formatter>_>
                *)local_178);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_170);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_170);
    std::
    unique_ptr<spdlog::details::S_formatter,_std::default_delete<spdlog::details::S_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::S_formatter,_std::default_delete<spdlog::details::S_formatter>_>
                 *)local_178);
    break;
  case 'T':
  case 'X':
    std::make_unique<spdlog::details::T_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_1f8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::T_formatter,std::default_delete<spdlog::details::T_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_1f0,
               (unique_ptr<spdlog::details::T_formatter,_std::default_delete<spdlog::details::T_formatter>_>
                *)local_1f8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_1f0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_1f0);
    std::
    unique_ptr<spdlog::details::T_formatter,_std::default_delete<spdlog::details::T_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::T_formatter,_std::default_delete<spdlog::details::T_formatter>_>
                 *)local_1f8);
    break;
  case 'Y':
    std::make_unique<spdlog::details::Y_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_108);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::Y_formatter,std::default_delete<spdlog::details::Y_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_100,
               (unique_ptr<spdlog::details::Y_formatter,_std::default_delete<spdlog::details::Y_formatter>_>
                *)local_108);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_100);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_100);
    std::
    unique_ptr<spdlog::details::Y_formatter,_std::default_delete<spdlog::details::Y_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::Y_formatter,_std::default_delete<spdlog::details::Y_formatter>_>
                 *)local_108);
    break;
  case '^':
    std::make_unique<spdlog::details::color_start_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_228);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::color_start_formatter,std::default_delete<spdlog::details::color_start_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_220,
               (unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
                *)local_228);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_220);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_220);
    std::
    unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::color_start_formatter,_std::default_delete<spdlog::details::color_start_formatter>_>
                   *)local_228);
    break;
  case 'a':
    std::make_unique<spdlog::details::a_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_a8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::a_formatter,std::default_delete<spdlog::details::a_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_a0,
               (unique_ptr<spdlog::details::a_formatter,_std::default_delete<spdlog::details::a_formatter>_>
                *)local_a8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_a0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_a0);
    std::
    unique_ptr<spdlog::details::a_formatter,_std::default_delete<spdlog::details::a_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::a_formatter,_std::default_delete<spdlog::details::a_formatter>_>
                 *)local_a8);
    break;
  case 'b':
  case 'h':
    std::make_unique<spdlog::details::b_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::b_formatter,std::default_delete<spdlog::details::b_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_c0,
               (unique_ptr<spdlog::details::b_formatter,_std::default_delete<spdlog::details::b_formatter>_>
                *)local_c8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_c0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_c0);
    std::
    unique_ptr<spdlog::details::b_formatter,_std::default_delete<spdlog::details::b_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::b_formatter,_std::default_delete<spdlog::details::b_formatter>_>
                 *)local_c8);
    break;
  case 'c':
    std::make_unique<spdlog::details::c_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_e8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::c_formatter,std::default_delete<spdlog::details::c_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_e0,
               (unique_ptr<spdlog::details::c_formatter,_std::default_delete<spdlog::details::c_formatter>_>
                *)local_e8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_e0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_e0);
    std::
    unique_ptr<spdlog::details::c_formatter,_std::default_delete<spdlog::details::c_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::c_formatter,_std::default_delete<spdlog::details::c_formatter>_>
                 *)local_e8);
    break;
  case 'd':
    std::make_unique<spdlog::details::d_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_138);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::d_formatter,std::default_delete<spdlog::details::d_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_130,
               (unique_ptr<spdlog::details::d_formatter,_std::default_delete<spdlog::details::d_formatter>_>
                *)local_138);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_130);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_130);
    std::
    unique_ptr<spdlog::details::d_formatter,_std::default_delete<spdlog::details::d_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::d_formatter,_std::default_delete<spdlog::details::d_formatter>_>
                 *)local_138);
    break;
  case 'e':
    std::make_unique<spdlog::details::e_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_188);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::e_formatter,std::default_delete<spdlog::details::e_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_180,
               (unique_ptr<spdlog::details::e_formatter,_std::default_delete<spdlog::details::e_formatter>_>
                *)local_188);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_180);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_180);
    std::
    unique_ptr<spdlog::details::e_formatter,_std::default_delete<spdlog::details::e_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::e_formatter,_std::default_delete<spdlog::details::e_formatter>_>
                 *)local_188);
    break;
  case 'f':
    std::make_unique<spdlog::details::f_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_198);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::f_formatter,std::default_delete<spdlog::details::f_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_190,
               (unique_ptr<spdlog::details::f_formatter,_std::default_delete<spdlog::details::f_formatter>_>
                *)local_198);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_190);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_190);
    std::
    unique_ptr<spdlog::details::f_formatter,_std::default_delete<spdlog::details::f_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::f_formatter,_std::default_delete<spdlog::details::f_formatter>_>
                 *)local_198);
    break;
  case 'l':
    std::make_unique<spdlog::details::level_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_68);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::level_formatter,std::default_delete<spdlog::details::level_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_60,
               (unique_ptr<spdlog::details::level_formatter,_std::default_delete<spdlog::details::level_formatter>_>
                *)local_68);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_60);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_60);
    std::
    unique_ptr<spdlog::details::level_formatter,_std::default_delete<spdlog::details::level_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::level_formatter,_std::default_delete<spdlog::details::level_formatter>_>
                   *)local_68);
    break;
  case 'm':
    std::make_unique<spdlog::details::m_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_128);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::m_formatter,std::default_delete<spdlog::details::m_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_120,
               (unique_ptr<spdlog::details::m_formatter,_std::default_delete<spdlog::details::m_formatter>_>
                *)local_128);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_120);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_120);
    std::
    unique_ptr<spdlog::details::m_formatter,_std::default_delete<spdlog::details::m_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::m_formatter,_std::default_delete<spdlog::details::m_formatter>_>
                 *)local_128);
    break;
  case 'n':
    std::make_unique<spdlog::details::name_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_58);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::name_formatter,std::default_delete<spdlog::details::name_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)local_50,
               (unique_ptr<spdlog::details::name_formatter,_std::default_delete<spdlog::details::name_formatter>_>
                *)local_58);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)local_50);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(local_50);
    std::
    unique_ptr<spdlog::details::name_formatter,_std::default_delete<spdlog::details::name_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::name_formatter,_std::default_delete<spdlog::details::name_formatter>_>
                   *)local_58);
    break;
  case 'p':
    std::make_unique<spdlog::details::p_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_1c8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::p_formatter,std::default_delete<spdlog::details::p_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_1c0,
               (unique_ptr<spdlog::details::p_formatter,_std::default_delete<spdlog::details::p_formatter>_>
                *)local_1c8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_1c0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_1c0);
    std::
    unique_ptr<spdlog::details::p_formatter,_std::default_delete<spdlog::details::p_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::p_formatter,_std::default_delete<spdlog::details::p_formatter>_>
                 *)local_1c8);
    break;
  case 'r':
    std::make_unique<spdlog::details::r_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_1d8);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::r_formatter,std::default_delete<spdlog::details::r_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_1d0,
               (unique_ptr<spdlog::details::r_formatter,_std::default_delete<spdlog::details::r_formatter>_>
                *)local_1d8);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_1d0);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_1d0);
    std::
    unique_ptr<spdlog::details::r_formatter,_std::default_delete<spdlog::details::r_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::r_formatter,_std::default_delete<spdlog::details::r_formatter>_>
                 *)local_1d8);
    break;
  case 's':
    std::make_unique<spdlog::details::source_filename_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_258);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::source_filename_formatter,std::default_delete<spdlog::details::source_filename_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_250,
               (unique_ptr<spdlog::details::source_filename_formatter,_std::default_delete<spdlog::details::source_filename_formatter>_>
                *)local_258);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_250);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_250);
    std::
    unique_ptr<spdlog::details::source_filename_formatter,_std::default_delete<spdlog::details::source_filename_formatter>_>
    ::~unique_ptr((unique_ptr<spdlog::details::source_filename_formatter,_std::default_delete<spdlog::details::source_filename_formatter>_>
                   *)local_258);
    break;
  case 't':
    std::make_unique<spdlog::details::t_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_88);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::t_formatter,std::default_delete<spdlog::details::t_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_80,
               (unique_ptr<spdlog::details::t_formatter,_std::default_delete<spdlog::details::t_formatter>_>
                *)local_88);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_80);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_80);
    std::
    unique_ptr<spdlog::details::t_formatter,_std::default_delete<spdlog::details::t_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::t_formatter,_std::default_delete<spdlog::details::t_formatter>_>
                 *)local_88);
    break;
  case 'v':
    std::make_unique<spdlog::details::v_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_98);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::v_formatter,std::default_delete<spdlog::details::v_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_90,
               (unique_ptr<spdlog::details::v_formatter,_std::default_delete<spdlog::details::v_formatter>_>
                *)local_98);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_90);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_90);
    std::
    unique_ptr<spdlog::details::v_formatter,_std::default_delete<spdlog::details::v_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::v_formatter,_std::default_delete<spdlog::details::v_formatter>_>
                 *)local_98);
    break;
  case 'z':
    std::make_unique<spdlog::details::z_formatter,spdlog::details::padding_info&>
              ((padding_info *)local_208);
    std::
    unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
    ::
    unique_ptr<spdlog::details::z_formatter,std::default_delete<spdlog::details::z_formatter>,void>
              ((unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>
                *)&local_200,
               (unique_ptr<spdlog::details::z_formatter,_std::default_delete<spdlog::details::z_formatter>_>
                *)local_208);
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ::push_back(&this->formatters_,(value_type *)&local_200);
    std::
    unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
    ::~unique_ptr(&local_200);
    std::
    unique_ptr<spdlog::details::z_formatter,_std::default_delete<spdlog::details::z_formatter>_>::
    ~unique_ptr((unique_ptr<spdlog::details::z_formatter,_std::default_delete<spdlog::details::z_formatter>_>
                 *)local_208);
  }
  return;
}

Assistant:

void handle_flag_(char flag, details::padding_info padding)
    {
        switch (flag)
        {

        case ('+'): // default formatter
            formatters_.push_back(details::make_unique<details::full_formatter>(padding));
            break;

        case 'n': // logger name
            formatters_.push_back(details::make_unique<details::name_formatter>(padding));
            break;

        case 'l': // level
            formatters_.push_back(details::make_unique<details::level_formatter>(padding));
            break;

        case 'L': // short level
            formatters_.push_back(details::make_unique<details::short_level_formatter>(padding));
            break;

        case ('t'): // thread id
            formatters_.push_back(details::make_unique<details::t_formatter>(padding));
            break;

        case ('v'): // the message text
            formatters_.push_back(details::make_unique<details::v_formatter>(padding));
            break;

        case ('a'): // weekday
            formatters_.push_back(details::make_unique<details::a_formatter>(padding));
            break;

        case ('A'): // short weekday
            formatters_.push_back(details::make_unique<details::A_formatter>(padding));
            break;

        case ('b'):
        case ('h'): // month
            formatters_.push_back(details::make_unique<details::b_formatter>(padding));
            break;

        case ('B'): // short month
            formatters_.push_back(details::make_unique<details::B_formatter>(padding));
            break;

        case ('c'): // datetime
            formatters_.push_back(details::make_unique<details::c_formatter>(padding));
            break;

        case ('C'): // year 2 digits
            formatters_.push_back(details::make_unique<details::C_formatter>(padding));
            break;

        case ('Y'): // year 4 digits
            formatters_.push_back(details::make_unique<details::Y_formatter>(padding));
            break;

        case ('D'):
        case ('x'): // datetime MM/DD/YY
            formatters_.push_back(details::make_unique<details::D_formatter>(padding));
            break;

        case ('m'): // month 1-12
            formatters_.push_back(details::make_unique<details::m_formatter>(padding));
            break;

        case ('d'): // day of month 1-31
            formatters_.push_back(details::make_unique<details::d_formatter>(padding));
            break;

        case ('H'): // hours 24
            formatters_.push_back(details::make_unique<details::H_formatter>(padding));
            break;

        case ('I'): // hours 12
            formatters_.push_back(details::make_unique<details::I_formatter>(padding));
            break;

        case ('M'): // minutes
            formatters_.push_back(details::make_unique<details::M_formatter>(padding));
            break;

        case ('S'): // seconds
            formatters_.push_back(details::make_unique<details::S_formatter>(padding));
            break;

        case ('e'): // milliseconds
            formatters_.push_back(details::make_unique<details::e_formatter>(padding));
            break;

        case ('f'): // microseconds
            formatters_.push_back(details::make_unique<details::f_formatter>(padding));
            break;

        case ('F'): // nanoseconds
            formatters_.push_back(details::make_unique<details::F_formatter>(padding));
            break;

        case ('E'): // seconds since epoch
            formatters_.push_back(details::make_unique<details::E_formatter>(padding));
            break;

        case ('p'): // am/pm
            formatters_.push_back(details::make_unique<details::p_formatter>(padding));
            break;

        case ('r'): // 12 hour clock 02:55:02 pm
            formatters_.push_back(details::make_unique<details::r_formatter>(padding));
            break;

        case ('R'): // 24-hour HH:MM time
            formatters_.push_back(details::make_unique<details::R_formatter>(padding));
            break;

        case ('T'):
        case ('X'): // ISO 8601 time format (HH:MM:SS)
            formatters_.push_back(details::make_unique<details::T_formatter>(padding));
            break;

        case ('z'): // timezone
            formatters_.push_back(details::make_unique<details::z_formatter>(padding));
            break;

        case ('P'): // pid
            formatters_.push_back(details::make_unique<details::pid_formatter>(padding));
            break;

#ifdef SPDLOG_ENABLE_MESSAGE_COUNTER
        case ('i'):
            formatters_.push_back(details::make_unique<details::i_formatter>(padding));
            break;
#endif
        case ('^'): // color range start
            formatters_.push_back(details::make_unique<details::color_start_formatter>(padding));
            break;

        case ('$'): // color range end
            formatters_.push_back(details::make_unique<details::color_stop_formatter>(padding));
            break;

        case ('@'): // source location (filename:filenumber)
            formatters_.push_back(details::make_unique<details::source_location_formatter>(padding));
            break;

        case ('s'): // source filename
            formatters_.push_back(details::make_unique<details::source_filename_formatter>(padding));
            break;

        case ('#'): // source line number
            formatters_.push_back(details::make_unique<details::source_linenum_formatter>(padding));
            break;

        case ('%'): // % char
            formatters_.push_back(details::make_unique<details::ch_formatter>('%'));
            break;

        default: // Unknown flag appears as is
            auto unknown_flag = details::make_unique<details::aggregate_formatter>();
            unknown_flag->add_ch('%');
            unknown_flag->add_ch(flag);
            formatters_.push_back((std::move(unknown_flag)));
            break;
        }
    }